

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ConsumerIPCService::FreeBuffers
          (ConsumerIPCService *this,FreeBuffersRequest *param_1,DeferredFreeBuffersResponse *resp)

{
  RemoteConsumer *pRVar1;
  pointer pCVar2;
  AsyncResult<perfetto::protos::gen::FreeBuffersResponse> local_30;
  DeferredFreeBuffersResponse *local_20;
  DeferredFreeBuffersResponse *resp_local;
  FreeBuffersRequest *param_1_local;
  ConsumerIPCService *this_local;
  
  local_20 = resp;
  resp_local = (DeferredFreeBuffersResponse *)param_1;
  param_1_local = (FreeBuffersRequest *)this;
  pRVar1 = GetConsumerForCurrentRequest(this);
  pCVar2 = std::
           unique_ptr<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
           ::operator->(&pRVar1->service_endpoint);
  (*pCVar2->_vptr_ConsumerEndpoint[8])();
  ipc::AsyncResult<perfetto::protos::gen::FreeBuffersResponse>::Create();
  ipc::Deferred<perfetto::protos::gen::FreeBuffersResponse>::Resolve(resp,&local_30);
  ipc::AsyncResult<perfetto::protos::gen::FreeBuffersResponse>::~AsyncResult(&local_30);
  return;
}

Assistant:

void ConsumerIPCService::FreeBuffers(const protos::gen::FreeBuffersRequest&,
                                     DeferredFreeBuffersResponse resp) {
  GetConsumerForCurrentRequest()->service_endpoint->FreeBuffers();
  resp.Resolve(ipc::AsyncResult<protos::gen::FreeBuffersResponse>::Create());
}